

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O2

utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator++(utf8iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  byte bVar1;
  byte *pbVar2;
  long lStack_8;
  
  pbVar2 = (byte *)(this->_ptr)._M_current;
  bVar1 = *pbVar2;
  if (bVar1 < 0xf0) {
    if (bVar1 < 0xe0) {
      lStack_8 = 2 - (ulong)(bVar1 < 0xc0);
    }
    else {
      lStack_8 = 3;
    }
  }
  else {
    lStack_8 = 4;
  }
  (this->_ptr)._M_current = (char *)(pbVar2 + lStack_8);
  return this;
}

Assistant:

utf8iterator& operator++()
    {
        P p=_ptr;
        uint8_t b0= *p++;
        int n;
        if (b0>=0xf0) {
            n=3;
        }
        else if (b0>=0xe0) {
            n=2;
        }
        else if (b0>=0xc0) {
            n=1;
        }
        else {
            n=0;
        }
        while (n--) {
            p++;
        }
        _ptr= p;
        return *this;
    }